

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

void wiener_decompose_sep_sym(int wiener_win,int64_t *M,int64_t *H,int32_t *a,int32_t *b)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  long in_R8;
  int wiener_win2;
  int plane_off;
  int iter;
  int j;
  int i;
  int64_t *Mc [7];
  int64_t *Hc [49];
  int local_204;
  int local_200;
  int local_1fc;
  long local_1f8 [8];
  long local_1b8 [31];
  int32_t *in_stack_ffffffffffffff40;
  int32_t *in_stack_ffffffffffffff48;
  int64_t **in_stack_ffffffffffffff50;
  int64_t **in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff64;
  
  for (local_1fc = 0; local_1fc < in_EDI; local_1fc = local_1fc + 1) {
    iVar1 = wiener_decompose_sep_sym::init_filt[local_1fc + (7 - in_EDI >> 1)];
    *(int *)(in_R8 + (long)local_1fc * 4) = iVar1 << 9;
    *(int *)(in_RCX + (long)local_1fc * 4) = iVar1 << 9;
  }
  for (local_1fc = 0; local_1fc < in_EDI; local_1fc = local_1fc + 1) {
    local_1f8[local_1fc] = in_RSI + (long)(local_1fc * in_EDI) * 8;
    for (local_200 = 0; local_200 < in_EDI; local_200 = local_200 + 1) {
      local_1b8[local_1fc * in_EDI + local_200] =
           in_RDX + (long)(local_1fc * in_EDI * in_EDI * in_EDI) * 8 +
           (long)(local_200 * in_EDI) * 8;
    }
  }
  for (local_204 = 1; local_204 < 5; local_204 = local_204 + 1) {
    update_a_sep_sym(in_stack_ffffffffffffff64,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                     in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    update_b_sep_sym(in_stack_ffffffffffffff64,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                     in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  }
  return;
}

Assistant:

static void wiener_decompose_sep_sym(int wiener_win, int64_t *M, int64_t *H,
                                     int32_t *a, int32_t *b) {
  static const int32_t init_filt[WIENER_WIN] = {
    WIENER_FILT_TAP0_MIDV, WIENER_FILT_TAP1_MIDV, WIENER_FILT_TAP2_MIDV,
    WIENER_FILT_TAP3_MIDV, WIENER_FILT_TAP2_MIDV, WIENER_FILT_TAP1_MIDV,
    WIENER_FILT_TAP0_MIDV,
  };
  int64_t *Hc[WIENER_WIN2];
  int64_t *Mc[WIENER_WIN];
  int i, j, iter;
  const int plane_off = (WIENER_WIN - wiener_win) >> 1;
  const int wiener_win2 = wiener_win * wiener_win;
  for (i = 0; i < wiener_win; i++) {
    a[i] = b[i] =
        WIENER_TAP_SCALE_FACTOR / WIENER_FILT_STEP * init_filt[i + plane_off];
  }
  for (i = 0; i < wiener_win; i++) {
    Mc[i] = M + i * wiener_win;
    for (j = 0; j < wiener_win; j++) {
      Hc[i * wiener_win + j] =
          H + i * wiener_win * wiener_win2 + j * wiener_win;
    }
  }

  iter = 1;
  while (iter < NUM_WIENER_ITERS) {
    update_a_sep_sym(wiener_win, Mc, Hc, a, b);
    update_b_sep_sym(wiener_win, Mc, Hc, a, b);
    iter++;
  }
}